

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,
          int offset)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  double *pdVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  char *__assertion;
  long lVar18;
  int64_t k_3;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int64_t k_2;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    uVar4 = 0x2e;
  }
  else {
    bVar9 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar9 & 0x1f))) {
      (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(&qubits);
      iVar5 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar5 + offset;
      iVar6 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = offset + iVar6;
      if (iVar5 + offset < nbQubits) {
        if (offset + iVar6 < nbQubits) {
          iVar5 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])();
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
                    (&mat1,(long *)CONCAT44(extraout_var,iVar5));
          dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,&mat1);
          iVar5 = this->control_;
          iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
          if (iVar5 < iVar6) {
            iVar5 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
            iVar12 = 1 << ((char)iVar5 - (char)this->control_ & 0x1fU);
            iVar5 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
            iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
            bVar3 = (byte)iVar5 & 0x1f;
            lVar10 = (long)iVar12;
            lVar18 = (long)(1 << (~(byte)iVar6 + bVar9 & 0x1f));
            uVar25 = matrix->size_;
            lVar13 = 0;
            if (0 < lVar18) {
              lVar13 = lVar18;
            }
            uVar17 = (ulong)(uint)(1 << bVar3);
            if (1 << bVar3 < 1) {
              uVar17 = 0;
            }
            uVar11 = 0;
            if (0 < (long)uVar25) {
              uVar11 = uVar25;
            }
            lVar26 = (long)(iVar12 / 2);
            if (side == Left) {
              lVar24 = 0;
              for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
                iVar5 = this->controlState_;
                lVar23 = lVar24;
                for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
                  if (iVar5 == 1) {
                    if (lVar26 <= (long)uVar14 % lVar10) goto LAB_0011028e;
                  }
                  else if ((iVar5 != 0) || ((long)uVar14 % lVar10 < lVar26)) {
LAB_0011028e:
                    pdVar7 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                             super__Head_base<0UL,_double_*,_false>._M_head_impl;
                    lVar22 = lVar18 * uVar25 * 8 + lVar23;
                    lVar19 = lVar13;
                    while (bVar27 = lVar19 != 0, lVar19 = lVar19 + -1, bVar27) {
                      dVar1 = *(double *)((long)pdVar7 + lVar23);
                      dVar2 = *(double *)((long)pdVar7 + lVar22);
                      *(double *)((long)pdVar7 + lVar23) =
                           *(double *)
                            mat1.data_._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                           *(double *)
                            ((long)mat1.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) * dVar2;
                      *(double *)((long)pdVar7 + lVar22) =
                           dVar1 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                    mat1.size_ * 8) +
                           dVar2 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8
                                    + mat1.size_ * 8);
                      pdVar7 = pdVar7 + uVar25;
                    }
                  }
                  lVar23 = lVar23 + lVar18 * uVar25 * 0x10;
                }
                lVar24 = lVar24 + 8;
              }
            }
            else {
              lVar24 = lVar18 * 8;
              lVar23 = 0;
              for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
                iVar5 = this->controlState_;
                lVar22 = lVar24;
                lVar19 = lVar23;
                for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
                  if (iVar5 == 1) {
                    if (lVar26 <= (long)uVar14 % lVar10) goto LAB_001105f2;
                  }
                  else if ((iVar5 != 0) || ((long)uVar14 % lVar10 < lVar26)) {
LAB_001105f2:
                    pdVar7 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                             super__Head_base<0UL,_double_*,_false>._M_head_impl;
                    for (lVar20 = 0; lVar13 != lVar20; lVar20 = lVar20 + 1) {
                      dVar1 = *(double *)((long)pdVar7 + lVar20 * 8 + lVar19);
                      dVar2 = *(double *)((long)pdVar7 + lVar20 * 8 + lVar22);
                      *(double *)((long)pdVar7 + lVar20 * 8 + lVar19) =
                           *(double *)
                            mat1.data_._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                           *(double *)
                            ((long)mat1.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl +
                            mat1.size_ * 8) * dVar2;
                      *(double *)((long)pdVar7 + lVar20 * 8 + lVar22) =
                           dVar1 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8)
                           + dVar2 * *(double *)
                                      ((long)mat1.data_._M_t.
                                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                             .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                       8 + mat1.size_ * 8);
                    }
                  }
                  lVar22 = lVar22 + lVar18 * 0x10;
                  lVar19 = lVar19 + lVar18 * 0x10;
                }
                lVar24 = lVar24 + uVar25 * 8;
                lVar23 = lVar23 + uVar25 * 8;
              }
            }
          }
          else {
            iVar12 = 1 << (bVar9 - (char)this->control_ & 0x1f);
            iVar5 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
            iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
            bVar3 = (byte)iVar5 & 0x1f;
            lVar18 = (long)iVar12;
            lVar26 = (long)(1 << (~(byte)iVar6 + bVar9 & 0x1f));
            lVar13 = matrix->size_;
            lVar10 = 0;
            if (0 < lVar26) {
              lVar10 = lVar26;
            }
            uVar4 = 1 << bVar3;
            if (1 << bVar3 < 1) {
              uVar4 = 0;
            }
            lVar24 = 0;
            if (0 < lVar13) {
              lVar24 = lVar13;
            }
            lVar23 = (long)(iVar12 / 2);
            if (side == Left) {
              lVar19 = 0;
              for (lVar22 = 0; lVar22 != lVar24; lVar22 = lVar22 + 1) {
                lVar20 = lVar19;
                for (uVar25 = 0; uVar25 != uVar4; uVar25 = uVar25 + 1) {
                  iVar5 = this->controlState_;
                  pdVar7 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl;
                  lVar21 = lVar26 * lVar13 * 8 + lVar20;
                  for (lVar15 = 0; lVar10 != lVar15; lVar15 = lVar15 + 1) {
                    if (iVar5 == 1) {
                      if (lVar23 <= lVar15 % lVar18) goto LAB_00110403;
                    }
                    else if ((iVar5 != 0) || (lVar15 % lVar18 < lVar23)) {
LAB_00110403:
                      dVar1 = *(double *)((long)pdVar7 + lVar20);
                      dVar2 = *(double *)((long)pdVar7 + lVar21);
                      *(double *)((long)pdVar7 + lVar20) =
                           *(double *)
                            mat1.data_._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                           *(double *)
                            ((long)mat1.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) * dVar2;
                      *(double *)((long)pdVar7 + lVar21) =
                           dVar1 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                    mat1.size_ * 8) +
                           dVar2 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8
                                    + mat1.size_ * 8);
                    }
                    pdVar7 = pdVar7 + lVar13;
                  }
                  lVar20 = lVar20 + lVar26 * lVar13 * 0x10;
                }
                lVar19 = lVar19 + 8;
              }
            }
            else {
              lVar22 = lVar26 * 8;
              lVar20 = 0;
              for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
                lVar21 = lVar22;
                lVar15 = lVar20;
                for (uVar25 = 0; uVar25 != uVar4; uVar25 = uVar25 + 1) {
                  iVar5 = this->controlState_;
                  pdVar7 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl;
                  for (lVar16 = 0; lVar10 != lVar16; lVar16 = lVar16 + 1) {
                    if (iVar5 == 1) {
                      if (lVar23 <= lVar16 % lVar18) goto LAB_001104fc;
                    }
                    else if ((iVar5 != 0) || (lVar16 % lVar18 < lVar23)) {
LAB_001104fc:
                      dVar1 = *(double *)((long)pdVar7 + lVar16 * 8 + lVar15);
                      dVar2 = *(double *)((long)pdVar7 + lVar16 * 8 + lVar21);
                      *(double *)((long)pdVar7 + lVar16 * 8 + lVar15) =
                           *(double *)
                            mat1.data_._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                           *(double *)
                            ((long)mat1.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl +
                            mat1.size_ * 8) * dVar2;
                      *(double *)((long)pdVar7 + lVar16 * 8 + lVar21) =
                           dVar1 * *(double *)
                                    ((long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8)
                           + dVar2 * *(double *)
                                      ((long)mat1.data_._M_t.
                                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                             .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                       8 + mat1.size_ * 8);
                    }
                  }
                  lVar21 = lVar21 + lVar26 * 0x10;
                  lVar15 = lVar15 + lVar26 * 0x10;
                }
                lVar22 = lVar22 + lVar13 * 8;
                lVar20 = lVar20 + lVar13 * 8;
              }
            }
          }
          std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&mat1.data_);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&qubits.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      uVar4 = 0x33;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      uVar4 = 0x2f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,uVar4,
                "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }